

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write-cmake.cpp
# Opt level: O1

bool CMakeWriter::write_text_to_file_if_contents_changed
               (StringBuilder *sb,char *text,char *filename)

{
  string escaped_text;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  do {
    if (*text == '\"') {
      std::__cxx11::string::push_back((char)&local_50);
    }
    else if (*text == '\0') {
      chibi::StringBuilder::AppendFormat(sb,"file(WRITE \"%s.txt\" \"%s\")\n",filename,local_50);
      chibi::StringBuilder::AppendFormat
                (sb,"file(GENERATE OUTPUT \"%s\" INPUT \"%s.txt\")\n",filename,filename);
      std::__cxx11::string::append((char *)sb);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      return true;
    }
    std::__cxx11::string::push_back((char)&local_50);
    text = text + 1;
  } while( true );
}

Assistant:

static bool write_text_to_file_if_contents_changed(StringBuilder & sb, const char * text, const char * filename)
	{
		// escape the text so we can use 'file(WRITE ..)' from cmake to create the actual file inside the right directory
		
		std::string escaped_text;
		
		for (int i = 0; text[i] != 0; ++i)
		{
			const char c = text[i];

			if (c == '"')
			{
				escaped_text.push_back('\\');
				escaped_text.push_back('"');
			}
			else
				escaped_text.push_back(c);
		}

		sb.AppendFormat("file(WRITE \"%s.txt\" \"%s\")\n", filename, escaped_text.c_str());
		sb.AppendFormat("file(GENERATE OUTPUT \"%s\" INPUT \"%s.txt\")\n", filename, filename);
		sb.Append("\n");

		return true;
	}